

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_regexp_constructor_internal(JSContext *ctx,JSValue ctor,JSValue pattern,JSValue bc)

{
  int iVar1;
  JSValue getter;
  JSValue setter;
  JSValueUnion JVar2;
  JSRefCountHeader *p_1;
  JSValue this_obj;
  uint uStack_4c;
  uint uStack_3c;
  
  JVar2 = pattern.u;
  if ((pattern.tag & 0xffffffffU) == 0xfffffff9 && (bc.tag & 0xffffffffU) == 0xfffffff9) {
    this_obj = js_create_from_ctor(ctx,ctor,0x12);
    if ((int)this_obj.tag != 6) {
      ((JSValueUnion *)((long)this_obj.u.ptr + 0x30))->ptr = (void *)JVar2;
      *(JSValueUnion *)((long)this_obj.u.ptr + 0x38) = bc.u;
      getter.tag = 3;
      getter.u.ptr = (void *)((ulong)uStack_3c << 0x20);
      setter.tag = 3;
      setter.u.ptr = (void *)((ulong)uStack_4c << 0x20);
      JS_DefineProperty(ctx,this_obj,0x55,(JSValue)ZEXT816(0),getter,setter,0x2702);
      return this_obj;
    }
  }
  else {
    JS_ThrowTypeError(ctx,"string expected");
  }
  if ((0xfffffff4 < (uint)bc.tag) && (iVar1 = *bc.u.ptr, *(int *)bc.u.ptr = iVar1 + -1, iVar1 < 2))
  {
    __JS_FreeValueRT(ctx->rt,bc);
  }
  if ((0xfffffff4 < (uint)pattern.tag) &&
     (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,pattern);
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_regexp_constructor_internal(JSContext *ctx, JSValueConst ctor,
                                              JSValue pattern, JSValue bc)
{
    JSValue obj;
    JSObject *p;
    JSRegExp *re;

    /* sanity check */
    if (JS_VALUE_GET_TAG(bc) != JS_TAG_STRING ||
        JS_VALUE_GET_TAG(pattern) != JS_TAG_STRING) {
        JS_ThrowTypeError(ctx, "string expected");
    fail:
        JS_FreeValue(ctx, bc);
        JS_FreeValue(ctx, pattern);
        return JS_EXCEPTION;
    }

    obj = js_create_from_ctor(ctx, ctor, JS_CLASS_REGEXP);
    if (JS_IsException(obj))
        goto fail;
    p = JS_VALUE_GET_OBJ(obj);
    re = &p->u.regexp;
    re->pattern = JS_VALUE_GET_STRING(pattern);
    re->bytecode = JS_VALUE_GET_STRING(bc);
    JS_DefinePropertyValue(ctx, obj, JS_ATOM_lastIndex, JS_NewInt32(ctx, 0),
                           JS_PROP_WRITABLE);
    return obj;
}